

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRboStateQueryTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_1::checkRenderbufferComponentSize
               (TestContext *testCtx,CallLogWrapper *gl,int r,int g,int b,int a,int d,int s)

{
  GLenum pname;
  bool bVar1;
  qpTestResult qVar2;
  int *piVar3;
  TestLog *this;
  MessageBuilder *pMVar4;
  MessageBuilder local_1f8;
  undefined1 local_78 [8];
  StateQueryMemoryWriteGuard<int> state;
  int ndx;
  GLenum paramNames [6];
  int local_48 [2];
  int referenceSizes [6];
  int a_local;
  int b_local;
  int g_local;
  int r_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  local_48[0] = r;
  local_48[1] = g;
  referenceSizes[0] = b;
  referenceSizes[1] = a;
  referenceSizes[2] = d;
  referenceSizes[3] = s;
  stack0xffffffffffffff98 = 0x8d5100008d50;
  state.m_value = 0;
  do {
    if (5 < state.m_value) {
      return;
    }
    if (local_48[state.m_value] != -1) {
      deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
                ((StateQueryMemoryWriteGuard<int> *)local_78);
      pname = (&state.m_postguard)[state.m_value];
      piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                         ((StateQueryMemoryWriteGuard<int> *)local_78);
      glu::CallLogWrapper::glGetRenderbufferParameteriv(gl,0x8d41,pname,piVar3);
      bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                        ((StateQueryMemoryWriteGuard<int> *)local_78,testCtx);
      if (!bVar1) {
        return;
      }
      piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_78);
      if (*piVar3 < local_48[state.m_value]) {
        this = tcu::TestContext::getLog(testCtx);
        tcu::TestLog::operator<<(&local_1f8,this,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_1f8,(char (*) [40])"// ERROR: Expected greater or equal to ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_48 + state.m_value);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2b7cef6);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(StateQueryMemoryWriteGuard<int> *)local_78)
        ;
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1f8);
        qVar2 = tcu::TestContext::getTestResult(testCtx);
        if (qVar2 == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"got invalid value");
        }
      }
    }
    state.m_value = state.m_value + 1;
  } while( true );
}

Assistant:

void checkRenderbufferComponentSize (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, int r, int g, int b, int a, int d, int s)
{
	using tcu::TestLog;

	const int referenceSizes[] = {r, g, b, a, d, s};
	const GLenum paramNames[] =
	{
		GL_RENDERBUFFER_RED_SIZE,
		GL_RENDERBUFFER_GREEN_SIZE,
		GL_RENDERBUFFER_BLUE_SIZE,
		GL_RENDERBUFFER_ALPHA_SIZE,
		GL_RENDERBUFFER_DEPTH_SIZE,
		GL_RENDERBUFFER_STENCIL_SIZE
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(referenceSizes) == DE_LENGTH_OF_ARRAY(paramNames));

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(referenceSizes); ++ndx)
	{
		if (referenceSizes[ndx] == -1)
			continue;

		StateQueryMemoryWriteGuard<GLint> state;
		gl.glGetRenderbufferParameteriv(GL_RENDERBUFFER, paramNames[ndx], &state);

		if (!state.verifyValidity(testCtx))
			return;

		if (state < referenceSizes[ndx])
		{
			testCtx.getLog() << TestLog::Message << "// ERROR: Expected greater or equal to " << referenceSizes[ndx] << "; got " << state << TestLog::EndMessage;
			if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid value");
		}
	}
}